

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14PrivateFunctionMapFactory.cpp
# Opt level: O2

ElementFunctionMap *
COLLADASaxFWL14::FunctionMapFactory::createFunctionMap__library_physics_models__allChildren(void)

{
  int iVar1;
  mapped_type *pmVar2;
  
  if (createFunctionMap__library_physics_models__allChildren()::functionMap == '\0') {
    iVar1 = __cxa_guard_acquire(&createFunctionMap__library_physics_models__allChildren()::
                                 functionMap);
    if (iVar1 != 0) {
      createFunctionMap__library_physics_models__allChildren::functionMap._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      createFunctionMap__library_physics_models__allChildren::functionMap._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      createFunctionMap__library_physics_models__allChildren::functionMap._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left =
           &createFunctionMap__library_physics_models__allChildren::functionMap._M_t._M_impl.
            super__Rb_tree_header._M_header;
      createFunctionMap__library_physics_models__allChildren::functionMap._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right =
           &createFunctionMap__library_physics_models__allChildren::functionMap._M_t._M_impl.
            super__Rb_tree_header._M_header;
      createFunctionMap__library_physics_models__allChildren::functionMap._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      __cxa_atexit(std::
                   map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                   ::~map,&createFunctionMap__library_physics_models__allChildren::functionMap,
                   &__dso_handle);
      __cxa_guard_release(&createFunctionMap__library_physics_models__allChildren()::functionMap);
    }
  }
  if (createFunctionMap__library_physics_models__allChildren()::mapFilled == '\0') {
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_COLLADA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__COLLADA;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__COLLADA;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__COLLADA;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__COLLADA;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__COLLADA;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__COLLADA;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_PHYSICS_MODELS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__library_physics_models;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__library_physics_models;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__library_physics_models;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__library_physics_models;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__library_physics_models;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__library_physics_models;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_ASSET);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__asset;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__asset;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__asset;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__asset;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__asset;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__asset;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_PHYSICS_MODEL);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__physics_model;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__physics_model;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__physics_model;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__physics_model;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__physics_model;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__physics_model;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_CONTRIBUTOR);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__contributor;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__contributor;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__contributor;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__contributor;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__contributor;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__contributor;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_CREATED);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__created;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__created;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__created;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__created;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__created;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__created;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_KEYWORDS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__keywords
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__keywords;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__keywords;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__keywords;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__keywords;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__keywords;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_MODIFIED);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__modified
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__modified;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__modified;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__modified;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__modified;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__modified;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_REVISION);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__revision
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__revision;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__revision;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__revision;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__revision;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__revision;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_SUBJECT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__subject;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__subject;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__subject;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__subject;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__subject;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__subject;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_TITLE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__title;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__title;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__title;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__title;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__title;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__title;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_UNIT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__unit;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__unit;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__unit;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__unit;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__unit;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__unit;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_UP_AXIS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__up_axis;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__up_axis;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__up_axis;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__up_axis;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__up_axis;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__up_axis;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_AUTHOR);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__author;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__author;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__author;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__author;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__author;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__author;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_AUTHORING_TOOL);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__authoring_tool;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__authoring_tool;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__authoring_tool
    ;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__authoring_tool;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__authoring_tool;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__authoring_tool;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_COMMENTS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__comments
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__comments;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__comments;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__comments;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__comments;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__comments;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_COPYRIGHT);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__copyright;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__copyright;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__copyright;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__copyright;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__copyright;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__copyright;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_SOURCE_DATA);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__source_data;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__source_data;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__source_data;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__source_data;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__source_data;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__source_data;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_TECHNIQUE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__technique;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__technique;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__technique;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__technique;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__technique;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__technique;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_PHYSICS_MODEL);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_physics_model;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_physics_model;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_physics_model;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_physics_model;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__instance_physics_model;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_physics_model;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_RIGID_BODY);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__rigid_body;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__rigid_body
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__rigid_body;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__rigid_body;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__rigid_body;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__rigid_body;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_RIGID_CONSTRAINT);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__rigid_constraint;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__rigid_constraint;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__rigid_constraint;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__rigid_constraint
    ;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__rigid_constraint;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__rigid_constraint
    ;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_FORCE_FIELD);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_force_field;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_force_field;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_force_field;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_force_field;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__instance_force_field
    ;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_force_field;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_RIGID_BODY);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_rigid_body;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_rigid_body;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_rigid_body;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_rigid_body;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__instance_rigid_body;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_RIGID_CONSTRAINT);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_rigid_constraint;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_rigid_constraint;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_rigid_constraint;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_rigid_constraint;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__instance_rigid_constraint;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_constraint;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body__technique_common;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_ANGULAR_VELOCITY);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__angular_velocity;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__angular_velocity;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__angular_velocity;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__angular_velocity
    ;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__angular_velocity;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__angular_velocity
    ;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON__DYNAMIC);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common__dynamic;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common__dynamic;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common__dynamic;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common__dynamic;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common__dynamic;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::
         _freeAttributes__instance_rigid_body__technique_common__dynamic;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_INERTIA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__inertia;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__inertia;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__inertia;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__inertia;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__inertia;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__inertia;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_PHYSICS_MATERIAL);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_physics_material;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_physics_material;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_physics_material;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_physics_material;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__instance_physics_material;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_physics_material;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_MASS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__mass;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__mass;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__mass;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__mass;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__mass;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__mass;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON__MASS_FRAME);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common__mass_frame;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common__mass_frame;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common__mass_frame;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common__mass_frame
    ;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common__mass_frame;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::
         _freeAttributes__instance_rigid_body__technique_common__mass_frame;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_PHYSICS_MATERIAL);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__physics_material;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__physics_material;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__physics_material;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__physics_material
    ;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__physics_material;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__physics_material
    ;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON__SHAPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common__shape;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common__shape;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common__shape;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common__shape;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common__shape;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::
         _freeAttributes__instance_rigid_body__technique_common__shape;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_VELOCITY);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__velocity
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__velocity;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__velocity;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__velocity;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__velocity;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__velocity;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_ROTATE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__rotate;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__rotate;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__rotate;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__rotate;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__rotate;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__rotate;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_TRANSLATE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__translate;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__translate;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__translate;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__translate;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__translate;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__translate;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_PHYSICS_MATERIAL__TECHNIQUE_COMMON);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__physics_material__technique_common;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__physics_material__technique_common;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__physics_material__technique_common;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__physics_material__technique_common;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__physics_material__technique_common;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__physics_material__technique_common;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_DYNAMIC_FRICTION);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__dynamic_friction;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__dynamic_friction;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__dynamic_friction;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__dynamic_friction
    ;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__dynamic_friction;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__dynamic_friction
    ;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_RESTITUTION);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__restitution;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__restitution;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__restitution;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__restitution;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__restitution;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__restitution;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_STATIC_FRICTION);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__static_friction;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__static_friction;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__static_friction;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__static_friction;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__static_friction;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__static_friction;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_BOX);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__box;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__box;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__box;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__box;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__box;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__box;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_CAPSULE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__capsule;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__capsule;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__capsule;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__capsule;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__capsule;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__capsule;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_CYLINDER);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__cylinder
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__cylinder;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__cylinder;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__cylinder;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__cylinder;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__cylinder;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_DENSITY);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__density;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__density;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__density;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__density;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__density;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__density;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON__SHAPE__HOLLOW);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common__shape__hollow
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common__shape__hollow;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common__shape__hollow;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::
         _preBegin__instance_rigid_body__technique_common__shape__hollow;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::
         _preEnd__instance_rigid_body__technique_common__shape__hollow;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::
         _freeAttributes__instance_rigid_body__technique_common__shape__hollow;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_GEOMETRY);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_geometry;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_geometry;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_geometry;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_geometry;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__instance_geometry;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_geometry;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_MASS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__mass;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__mass;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__mass;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__mass;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__mass;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__mass;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_PLANE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__plane;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__plane;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__plane;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__plane;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__plane;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__plane;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_SPHERE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__sphere;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__sphere;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__sphere;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__sphere;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__sphere;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__sphere;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_TAPERED_CAPSULE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__tapered_capsule;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__tapered_capsule;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__tapered_capsule;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__tapered_capsule;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__tapered_capsule;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__tapered_capsule;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_TAPERED_CYLINDER);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__tapered_cylinder;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__tapered_cylinder;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__tapered_cylinder;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__tapered_cylinder
    ;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__tapered_cylinder;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__tapered_cylinder
    ;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_HALF_EXTENTS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__half_extents;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__half_extents;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__half_extents;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__half_extents;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__half_extents;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__half_extents;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_HEIGHT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__height;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__height;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__height;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__height;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__height;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__height;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_RADIUS____FLOAT2);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__radius____float2;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__radius____float2;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__radius____float2;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__radius____float2
    ;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__radius____float2;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__radius____float2
    ;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_HEIGHT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__height;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__height;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__height;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__height;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__height;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__height;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_RADIUS____FLOAT2);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__radius____float2;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__radius____float2;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__radius____float2;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__radius____float2
    ;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__radius____float2;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__radius____float2
    ;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_BIND_MATERIAL);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__bind_material;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__bind_material;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__bind_material;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__bind_material;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__bind_material;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__bind_material;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_PARAM);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__param;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__param;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__param;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__param;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__param;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__param;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_BIND_MATERIAL__TECHNIQUE_COMMON);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__bind_material__technique_common;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__bind_material__technique_common;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__bind_material__technique_common
    ;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__bind_material__technique_common;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__bind_material__technique_common;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__bind_material__technique_common;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_MATERIAL);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_material;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_material;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_material;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_material;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__instance_material;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_material;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_INSTANCE_MATERIAL__BIND);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__instance_material__bind;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__instance_material__bind;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__instance_material__bind;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__instance_material__bind;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__instance_material__bind;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__instance_material__bind;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_BIND_VERTEX_INPUT);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__bind_vertex_input;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__bind_vertex_input;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__bind_vertex_input;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__bind_vertex_input;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__bind_vertex_input;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__bind_vertex_input;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_EQUATION);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__equation
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__equation;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__equation;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__equation;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__equation;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__equation;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_RADIUS____FLOAT);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__radius____float;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__radius____float;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__radius____float;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__radius____float;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__radius____float;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__radius____float;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_HEIGHT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__height;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__height;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__height;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__height;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__height;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__height;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_RADIUS1);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__radius1;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__radius1;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__radius1;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__radius1;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__radius1;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__radius1;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_RADIUS2);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__radius2;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__radius2;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__radius2;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__radius2;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__radius2;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__radius2;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_HEIGHT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__height;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__height;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__height;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__height;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__height;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__height;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_RADIUS1);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__radius1;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__radius1;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__radius1;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__radius1;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__radius1;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__radius1;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_RADIUS2);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__radius2;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__radius2;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__radius2;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__radius2;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__radius2;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__radius2;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_RIGID_BODY__TECHNIQUE_COMMON);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__rigid_body__technique_common;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__rigid_body__technique_common;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__rigid_body__technique_common;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__rigid_body__technique_common;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_RIGID_BODY__TECHNIQUE_COMMON__DYNAMIC);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__rigid_body__technique_common__dynamic;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__rigid_body__technique_common__dynamic;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__rigid_body__technique_common__dynamic;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common__dynamic;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common__dynamic;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__rigid_body__technique_common__dynamic;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_INERTIA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__inertia;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__inertia;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__inertia;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__inertia;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__inertia;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__inertia;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_MASS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__mass;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__mass;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__mass;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__mass;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__mass;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__mass;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_RIGID_BODY__TECHNIQUE_COMMON__MASS_FRAME);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__rigid_body__technique_common__mass_frame;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__rigid_body__technique_common__mass_frame;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__rigid_body__technique_common__mass_frame;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common__mass_frame;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common__mass_frame;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__rigid_body__technique_common__mass_frame;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_RIGID_BODY__TECHNIQUE_COMMON__SHAPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__rigid_body__technique_common__shape;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__rigid_body__technique_common__shape;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__rigid_body__technique_common__shape;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common__shape;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common__shape;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__rigid_body__technique_common__shape;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_DENSITY);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__density;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__density;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__density;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__density;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__density;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__density;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_RIGID_BODY__TECHNIQUE_COMMON__SHAPE__HOLLOW);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__rigid_body__technique_common__shape__hollow;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__rigid_body__technique_common__shape__hollow;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__rigid_body__technique_common__shape__hollow;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common__shape__hollow;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common__shape__hollow;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__rigid_body__technique_common__shape__hollow
    ;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_MASS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__mass;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__mass;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__mass;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__mass;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__mass;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__mass;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_ATTACHMENT);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__attachment;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__attachment
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__attachment;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__attachment;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__attachment;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__attachment;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_REF_ATTACHMENT);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__ref_attachment;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__ref_attachment;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__ref_attachment
    ;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__ref_attachment;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__ref_attachment;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__ref_attachment;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_RIGID_CONSTRAINT__TECHNIQUE_COMMON);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen14Private::_begin__rigid_constraint__technique_common;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen14Private::_data__rigid_constraint__technique_common;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen14Private::_end__rigid_constraint__technique_common;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__rigid_constraint__technique_common;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen14Private::_preEnd__rigid_constraint__technique_common;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__rigid_constraint__technique_common;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_ENABLED);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__enabled;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__enabled;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__enabled;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__enabled;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__enabled;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__enabled;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_INTERPENETRATE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__interpenetrate;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__interpenetrate;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__interpenetrate
    ;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__interpenetrate;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__interpenetrate;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__interpenetrate;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_LIMITS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__limits;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__limits;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__limits;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__limits;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__limits;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__limits;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_SPRING);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__spring;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__spring;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__spring;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__spring;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__spring;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__spring;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_LIMITS__LINEAR);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__limits__linear;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__limits__linear;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__limits__linear
    ;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__limits__linear;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__limits__linear;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__limits__linear;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_SWING_CONE_AND_TWIST);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__swing_cone_and_twist;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__swing_cone_and_twist;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__swing_cone_and_twist;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen14Private::_preBegin__swing_cone_and_twist;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__swing_cone_and_twist
    ;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen14Private::_freeAttributes__swing_cone_and_twist;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_MAX);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__max;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__max;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__max;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__max;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__max;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__max;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_MIN);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__min;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__min;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__min;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__min;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__min;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__min;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_MAX);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__max;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__max;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__max;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__max;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__max;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__max;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_MIN);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__min;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__min;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__min;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__min;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__min;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__min;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_ANGULAR);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__angular;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__angular;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__angular;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__angular;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__angular;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__angular;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_SPRING__LINEAR);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__spring__linear;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__spring__linear;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__spring__linear
    ;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__spring__linear;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__spring__linear;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__spring__linear;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_DAMPING);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__damping;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__damping;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__damping;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__damping;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__damping;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__damping;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_STIFFNESS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__stiffness;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__stiffness;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__stiffness;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__stiffness;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__stiffness;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__stiffness;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_TARGET_VALUE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__target_value;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__target_value;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__target_value;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__target_value;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__target_value;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__target_value;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_DAMPING);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__damping;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__damping;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__damping;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__damping;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__damping;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__damping;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_STIFFNESS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__stiffness;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__stiffness;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__stiffness;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__stiffness;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__stiffness;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__stiffness;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_physics_models__allChildren::functionMap,
                          &HASH_ELEMENT_TARGET_VALUE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen14Private::_begin__target_value;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen14Private::_data__target_value;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen14Private::_end__target_value;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen14Private::_preBegin__target_value;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen14Private::_preEnd__target_value;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen14Private::_freeAttributes__target_value;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    createFunctionMap__library_physics_models__allChildren()::mapFilled = '\x01';
  }
  return &createFunctionMap__library_physics_models__allChildren::functionMap;
}

Assistant:

const ColladaParserAutoGen14Private::ElementFunctionMap& FunctionMapFactory::createFunctionMap__library_physics_models__allChildren() {
static ColladaParserAutoGen14Private::ElementFunctionMap functionMap;
static bool mapFilled = false;
if ( !mapFilled )
{
functionMap[HASH_ELEMENT_COLLADA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__COLLADA, &ColladaParserAutoGen14Private::_data__COLLADA, &ColladaParserAutoGen14Private::_end__COLLADA, &ColladaParserAutoGen14Private::_preBegin__COLLADA, &ColladaParserAutoGen14Private::_preEnd__COLLADA, &ColladaParserAutoGen14Private::_freeAttributes__COLLADA);
functionMap[HASH_ELEMENT_LIBRARY_PHYSICS_MODELS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_physics_models, &ColladaParserAutoGen14Private::_data__library_physics_models, &ColladaParserAutoGen14Private::_end__library_physics_models, &ColladaParserAutoGen14Private::_preBegin__library_physics_models, &ColladaParserAutoGen14Private::_preEnd__library_physics_models, &ColladaParserAutoGen14Private::_freeAttributes__library_physics_models);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__asset, &ColladaParserAutoGen14Private::_data__asset, &ColladaParserAutoGen14Private::_end__asset, &ColladaParserAutoGen14Private::_preBegin__asset, &ColladaParserAutoGen14Private::_preEnd__asset, &ColladaParserAutoGen14Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__extra, &ColladaParserAutoGen14Private::_data__extra, &ColladaParserAutoGen14Private::_end__extra, &ColladaParserAutoGen14Private::_preBegin__extra, &ColladaParserAutoGen14Private::_preEnd__extra, &ColladaParserAutoGen14Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_PHYSICS_MODEL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__physics_model, &ColladaParserAutoGen14Private::_data__physics_model, &ColladaParserAutoGen14Private::_end__physics_model, &ColladaParserAutoGen14Private::_preBegin__physics_model, &ColladaParserAutoGen14Private::_preEnd__physics_model, &ColladaParserAutoGen14Private::_freeAttributes__physics_model);
functionMap[HASH_ELEMENT_CONTRIBUTOR] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__contributor, &ColladaParserAutoGen14Private::_data__contributor, &ColladaParserAutoGen14Private::_end__contributor, &ColladaParserAutoGen14Private::_preBegin__contributor, &ColladaParserAutoGen14Private::_preEnd__contributor, &ColladaParserAutoGen14Private::_freeAttributes__contributor);
functionMap[HASH_ELEMENT_CREATED] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__created, &ColladaParserAutoGen14Private::_data__created, &ColladaParserAutoGen14Private::_end__created, &ColladaParserAutoGen14Private::_preBegin__created, &ColladaParserAutoGen14Private::_preEnd__created, &ColladaParserAutoGen14Private::_freeAttributes__created);
functionMap[HASH_ELEMENT_KEYWORDS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__keywords, &ColladaParserAutoGen14Private::_data__keywords, &ColladaParserAutoGen14Private::_end__keywords, &ColladaParserAutoGen14Private::_preBegin__keywords, &ColladaParserAutoGen14Private::_preEnd__keywords, &ColladaParserAutoGen14Private::_freeAttributes__keywords);
functionMap[HASH_ELEMENT_MODIFIED] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__modified, &ColladaParserAutoGen14Private::_data__modified, &ColladaParserAutoGen14Private::_end__modified, &ColladaParserAutoGen14Private::_preBegin__modified, &ColladaParserAutoGen14Private::_preEnd__modified, &ColladaParserAutoGen14Private::_freeAttributes__modified);
functionMap[HASH_ELEMENT_REVISION] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__revision, &ColladaParserAutoGen14Private::_data__revision, &ColladaParserAutoGen14Private::_end__revision, &ColladaParserAutoGen14Private::_preBegin__revision, &ColladaParserAutoGen14Private::_preEnd__revision, &ColladaParserAutoGen14Private::_freeAttributes__revision);
functionMap[HASH_ELEMENT_SUBJECT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__subject, &ColladaParserAutoGen14Private::_data__subject, &ColladaParserAutoGen14Private::_end__subject, &ColladaParserAutoGen14Private::_preBegin__subject, &ColladaParserAutoGen14Private::_preEnd__subject, &ColladaParserAutoGen14Private::_freeAttributes__subject);
functionMap[HASH_ELEMENT_TITLE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__title, &ColladaParserAutoGen14Private::_data__title, &ColladaParserAutoGen14Private::_end__title, &ColladaParserAutoGen14Private::_preBegin__title, &ColladaParserAutoGen14Private::_preEnd__title, &ColladaParserAutoGen14Private::_freeAttributes__title);
functionMap[HASH_ELEMENT_UNIT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__unit, &ColladaParserAutoGen14Private::_data__unit, &ColladaParserAutoGen14Private::_end__unit, &ColladaParserAutoGen14Private::_preBegin__unit, &ColladaParserAutoGen14Private::_preEnd__unit, &ColladaParserAutoGen14Private::_freeAttributes__unit);
functionMap[HASH_ELEMENT_UP_AXIS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__up_axis, &ColladaParserAutoGen14Private::_data__up_axis, &ColladaParserAutoGen14Private::_end__up_axis, &ColladaParserAutoGen14Private::_preBegin__up_axis, &ColladaParserAutoGen14Private::_preEnd__up_axis, &ColladaParserAutoGen14Private::_freeAttributes__up_axis);
functionMap[HASH_ELEMENT_AUTHOR] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__author, &ColladaParserAutoGen14Private::_data__author, &ColladaParserAutoGen14Private::_end__author, &ColladaParserAutoGen14Private::_preBegin__author, &ColladaParserAutoGen14Private::_preEnd__author, &ColladaParserAutoGen14Private::_freeAttributes__author);
functionMap[HASH_ELEMENT_AUTHORING_TOOL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__authoring_tool, &ColladaParserAutoGen14Private::_data__authoring_tool, &ColladaParserAutoGen14Private::_end__authoring_tool, &ColladaParserAutoGen14Private::_preBegin__authoring_tool, &ColladaParserAutoGen14Private::_preEnd__authoring_tool, &ColladaParserAutoGen14Private::_freeAttributes__authoring_tool);
functionMap[HASH_ELEMENT_COMMENTS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__comments, &ColladaParserAutoGen14Private::_data__comments, &ColladaParserAutoGen14Private::_end__comments, &ColladaParserAutoGen14Private::_preBegin__comments, &ColladaParserAutoGen14Private::_preEnd__comments, &ColladaParserAutoGen14Private::_freeAttributes__comments);
functionMap[HASH_ELEMENT_COPYRIGHT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__copyright, &ColladaParserAutoGen14Private::_data__copyright, &ColladaParserAutoGen14Private::_end__copyright, &ColladaParserAutoGen14Private::_preBegin__copyright, &ColladaParserAutoGen14Private::_preEnd__copyright, &ColladaParserAutoGen14Private::_freeAttributes__copyright);
functionMap[HASH_ELEMENT_SOURCE_DATA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__source_data, &ColladaParserAutoGen14Private::_data__source_data, &ColladaParserAutoGen14Private::_end__source_data, &ColladaParserAutoGen14Private::_preBegin__source_data, &ColladaParserAutoGen14Private::_preEnd__source_data, &ColladaParserAutoGen14Private::_freeAttributes__source_data);
functionMap[HASH_ELEMENT_TECHNIQUE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__technique, &ColladaParserAutoGen14Private::_data__technique, &ColladaParserAutoGen14Private::_end__technique, &ColladaParserAutoGen14Private::_preBegin__technique, &ColladaParserAutoGen14Private::_preEnd__technique, &ColladaParserAutoGen14Private::_freeAttributes__technique);
functionMap[HASH_ELEMENT_INSTANCE_PHYSICS_MODEL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_physics_model, &ColladaParserAutoGen14Private::_data__instance_physics_model, &ColladaParserAutoGen14Private::_end__instance_physics_model, &ColladaParserAutoGen14Private::_preBegin__instance_physics_model, &ColladaParserAutoGen14Private::_preEnd__instance_physics_model, &ColladaParserAutoGen14Private::_freeAttributes__instance_physics_model);
functionMap[HASH_ELEMENT_RIGID_BODY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rigid_body, &ColladaParserAutoGen14Private::_data__rigid_body, &ColladaParserAutoGen14Private::_end__rigid_body, &ColladaParserAutoGen14Private::_preBegin__rigid_body, &ColladaParserAutoGen14Private::_preEnd__rigid_body, &ColladaParserAutoGen14Private::_freeAttributes__rigid_body);
functionMap[HASH_ELEMENT_RIGID_CONSTRAINT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rigid_constraint, &ColladaParserAutoGen14Private::_data__rigid_constraint, &ColladaParserAutoGen14Private::_end__rigid_constraint, &ColladaParserAutoGen14Private::_preBegin__rigid_constraint, &ColladaParserAutoGen14Private::_preEnd__rigid_constraint, &ColladaParserAutoGen14Private::_freeAttributes__rigid_constraint);
functionMap[HASH_ELEMENT_INSTANCE_FORCE_FIELD] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_force_field, &ColladaParserAutoGen14Private::_data__instance_force_field, &ColladaParserAutoGen14Private::_end__instance_force_field, &ColladaParserAutoGen14Private::_preBegin__instance_force_field, &ColladaParserAutoGen14Private::_preEnd__instance_force_field, &ColladaParserAutoGen14Private::_freeAttributes__instance_force_field);
functionMap[HASH_ELEMENT_INSTANCE_RIGID_BODY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_rigid_body, &ColladaParserAutoGen14Private::_data__instance_rigid_body, &ColladaParserAutoGen14Private::_end__instance_rigid_body, &ColladaParserAutoGen14Private::_preBegin__instance_rigid_body, &ColladaParserAutoGen14Private::_preEnd__instance_rigid_body, &ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body);
functionMap[HASH_ELEMENT_INSTANCE_RIGID_CONSTRAINT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_rigid_constraint, &ColladaParserAutoGen14Private::_data__instance_rigid_constraint, &ColladaParserAutoGen14Private::_end__instance_rigid_constraint, &ColladaParserAutoGen14Private::_preBegin__instance_rigid_constraint, &ColladaParserAutoGen14Private::_preEnd__instance_rigid_constraint, &ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_constraint);
functionMap[HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common, &ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common, &ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common, &ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common, &ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common, &ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body__technique_common);
functionMap[HASH_ELEMENT_ANGULAR_VELOCITY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__angular_velocity, &ColladaParserAutoGen14Private::_data__angular_velocity, &ColladaParserAutoGen14Private::_end__angular_velocity, &ColladaParserAutoGen14Private::_preBegin__angular_velocity, &ColladaParserAutoGen14Private::_preEnd__angular_velocity, &ColladaParserAutoGen14Private::_freeAttributes__angular_velocity);
functionMap[HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON__DYNAMIC] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body__technique_common__dynamic);
functionMap[HASH_ELEMENT_INERTIA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__inertia, &ColladaParserAutoGen14Private::_data__inertia, &ColladaParserAutoGen14Private::_end__inertia, &ColladaParserAutoGen14Private::_preBegin__inertia, &ColladaParserAutoGen14Private::_preEnd__inertia, &ColladaParserAutoGen14Private::_freeAttributes__inertia);
functionMap[HASH_ELEMENT_INSTANCE_PHYSICS_MATERIAL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_physics_material, &ColladaParserAutoGen14Private::_data__instance_physics_material, &ColladaParserAutoGen14Private::_end__instance_physics_material, &ColladaParserAutoGen14Private::_preBegin__instance_physics_material, &ColladaParserAutoGen14Private::_preEnd__instance_physics_material, &ColladaParserAutoGen14Private::_freeAttributes__instance_physics_material);
functionMap[HASH_ELEMENT_MASS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__mass, &ColladaParserAutoGen14Private::_data__mass, &ColladaParserAutoGen14Private::_end__mass, &ColladaParserAutoGen14Private::_preBegin__mass, &ColladaParserAutoGen14Private::_preEnd__mass, &ColladaParserAutoGen14Private::_freeAttributes__mass);
functionMap[HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON__MASS_FRAME] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body__technique_common__mass_frame);
functionMap[HASH_ELEMENT_PHYSICS_MATERIAL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__physics_material, &ColladaParserAutoGen14Private::_data__physics_material, &ColladaParserAutoGen14Private::_end__physics_material, &ColladaParserAutoGen14Private::_preBegin__physics_material, &ColladaParserAutoGen14Private::_preEnd__physics_material, &ColladaParserAutoGen14Private::_freeAttributes__physics_material);
functionMap[HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON__SHAPE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body__technique_common__shape);
functionMap[HASH_ELEMENT_VELOCITY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__velocity, &ColladaParserAutoGen14Private::_data__velocity, &ColladaParserAutoGen14Private::_end__velocity, &ColladaParserAutoGen14Private::_preBegin__velocity, &ColladaParserAutoGen14Private::_preEnd__velocity, &ColladaParserAutoGen14Private::_freeAttributes__velocity);
functionMap[HASH_ELEMENT_ROTATE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rotate, &ColladaParserAutoGen14Private::_data__rotate, &ColladaParserAutoGen14Private::_end__rotate, &ColladaParserAutoGen14Private::_preBegin__rotate, &ColladaParserAutoGen14Private::_preEnd__rotate, &ColladaParserAutoGen14Private::_freeAttributes__rotate);
functionMap[HASH_ELEMENT_TRANSLATE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__translate, &ColladaParserAutoGen14Private::_data__translate, &ColladaParserAutoGen14Private::_end__translate, &ColladaParserAutoGen14Private::_preBegin__translate, &ColladaParserAutoGen14Private::_preEnd__translate, &ColladaParserAutoGen14Private::_freeAttributes__translate);
functionMap[HASH_ELEMENT_PHYSICS_MATERIAL__TECHNIQUE_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__physics_material__technique_common, &ColladaParserAutoGen14Private::_data__physics_material__technique_common, &ColladaParserAutoGen14Private::_end__physics_material__technique_common, &ColladaParserAutoGen14Private::_preBegin__physics_material__technique_common, &ColladaParserAutoGen14Private::_preEnd__physics_material__technique_common, &ColladaParserAutoGen14Private::_freeAttributes__physics_material__technique_common);
functionMap[HASH_ELEMENT_DYNAMIC_FRICTION] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__dynamic_friction, &ColladaParserAutoGen14Private::_data__dynamic_friction, &ColladaParserAutoGen14Private::_end__dynamic_friction, &ColladaParserAutoGen14Private::_preBegin__dynamic_friction, &ColladaParserAutoGen14Private::_preEnd__dynamic_friction, &ColladaParserAutoGen14Private::_freeAttributes__dynamic_friction);
functionMap[HASH_ELEMENT_RESTITUTION] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__restitution, &ColladaParserAutoGen14Private::_data__restitution, &ColladaParserAutoGen14Private::_end__restitution, &ColladaParserAutoGen14Private::_preBegin__restitution, &ColladaParserAutoGen14Private::_preEnd__restitution, &ColladaParserAutoGen14Private::_freeAttributes__restitution);
functionMap[HASH_ELEMENT_STATIC_FRICTION] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__static_friction, &ColladaParserAutoGen14Private::_data__static_friction, &ColladaParserAutoGen14Private::_end__static_friction, &ColladaParserAutoGen14Private::_preBegin__static_friction, &ColladaParserAutoGen14Private::_preEnd__static_friction, &ColladaParserAutoGen14Private::_freeAttributes__static_friction);
functionMap[HASH_ELEMENT_BOX] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__box, &ColladaParserAutoGen14Private::_data__box, &ColladaParserAutoGen14Private::_end__box, &ColladaParserAutoGen14Private::_preBegin__box, &ColladaParserAutoGen14Private::_preEnd__box, &ColladaParserAutoGen14Private::_freeAttributes__box);
functionMap[HASH_ELEMENT_CAPSULE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__capsule, &ColladaParserAutoGen14Private::_data__capsule, &ColladaParserAutoGen14Private::_end__capsule, &ColladaParserAutoGen14Private::_preBegin__capsule, &ColladaParserAutoGen14Private::_preEnd__capsule, &ColladaParserAutoGen14Private::_freeAttributes__capsule);
functionMap[HASH_ELEMENT_CYLINDER] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__cylinder, &ColladaParserAutoGen14Private::_data__cylinder, &ColladaParserAutoGen14Private::_end__cylinder, &ColladaParserAutoGen14Private::_preBegin__cylinder, &ColladaParserAutoGen14Private::_preEnd__cylinder, &ColladaParserAutoGen14Private::_freeAttributes__cylinder);
functionMap[HASH_ELEMENT_DENSITY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__density, &ColladaParserAutoGen14Private::_data__density, &ColladaParserAutoGen14Private::_end__density, &ColladaParserAutoGen14Private::_preBegin__density, &ColladaParserAutoGen14Private::_preEnd__density, &ColladaParserAutoGen14Private::_freeAttributes__density);
functionMap[HASH_ELEMENT_INSTANCE_RIGID_BODY__TECHNIQUE_COMMON__SHAPE__HOLLOW] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_data__instance_rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_end__instance_rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_preBegin__instance_rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_preEnd__instance_rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_freeAttributes__instance_rigid_body__technique_common__shape__hollow);
functionMap[HASH_ELEMENT_INSTANCE_GEOMETRY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_geometry, &ColladaParserAutoGen14Private::_data__instance_geometry, &ColladaParserAutoGen14Private::_end__instance_geometry, &ColladaParserAutoGen14Private::_preBegin__instance_geometry, &ColladaParserAutoGen14Private::_preEnd__instance_geometry, &ColladaParserAutoGen14Private::_freeAttributes__instance_geometry);
functionMap[HASH_ELEMENT_MASS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__mass, &ColladaParserAutoGen14Private::_data__mass, &ColladaParserAutoGen14Private::_end__mass, &ColladaParserAutoGen14Private::_preBegin__mass, &ColladaParserAutoGen14Private::_preEnd__mass, &ColladaParserAutoGen14Private::_freeAttributes__mass);
functionMap[HASH_ELEMENT_PLANE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__plane, &ColladaParserAutoGen14Private::_data__plane, &ColladaParserAutoGen14Private::_end__plane, &ColladaParserAutoGen14Private::_preBegin__plane, &ColladaParserAutoGen14Private::_preEnd__plane, &ColladaParserAutoGen14Private::_freeAttributes__plane);
functionMap[HASH_ELEMENT_SPHERE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__sphere, &ColladaParserAutoGen14Private::_data__sphere, &ColladaParserAutoGen14Private::_end__sphere, &ColladaParserAutoGen14Private::_preBegin__sphere, &ColladaParserAutoGen14Private::_preEnd__sphere, &ColladaParserAutoGen14Private::_freeAttributes__sphere);
functionMap[HASH_ELEMENT_TAPERED_CAPSULE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__tapered_capsule, &ColladaParserAutoGen14Private::_data__tapered_capsule, &ColladaParserAutoGen14Private::_end__tapered_capsule, &ColladaParserAutoGen14Private::_preBegin__tapered_capsule, &ColladaParserAutoGen14Private::_preEnd__tapered_capsule, &ColladaParserAutoGen14Private::_freeAttributes__tapered_capsule);
functionMap[HASH_ELEMENT_TAPERED_CYLINDER] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__tapered_cylinder, &ColladaParserAutoGen14Private::_data__tapered_cylinder, &ColladaParserAutoGen14Private::_end__tapered_cylinder, &ColladaParserAutoGen14Private::_preBegin__tapered_cylinder, &ColladaParserAutoGen14Private::_preEnd__tapered_cylinder, &ColladaParserAutoGen14Private::_freeAttributes__tapered_cylinder);
functionMap[HASH_ELEMENT_HALF_EXTENTS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__half_extents, &ColladaParserAutoGen14Private::_data__half_extents, &ColladaParserAutoGen14Private::_end__half_extents, &ColladaParserAutoGen14Private::_preBegin__half_extents, &ColladaParserAutoGen14Private::_preEnd__half_extents, &ColladaParserAutoGen14Private::_freeAttributes__half_extents);
functionMap[HASH_ELEMENT_HEIGHT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__height, &ColladaParserAutoGen14Private::_data__height, &ColladaParserAutoGen14Private::_end__height, &ColladaParserAutoGen14Private::_preBegin__height, &ColladaParserAutoGen14Private::_preEnd__height, &ColladaParserAutoGen14Private::_freeAttributes__height);
functionMap[HASH_ELEMENT_RADIUS____FLOAT2] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__radius____float2, &ColladaParserAutoGen14Private::_data__radius____float2, &ColladaParserAutoGen14Private::_end__radius____float2, &ColladaParserAutoGen14Private::_preBegin__radius____float2, &ColladaParserAutoGen14Private::_preEnd__radius____float2, &ColladaParserAutoGen14Private::_freeAttributes__radius____float2);
functionMap[HASH_ELEMENT_HEIGHT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__height, &ColladaParserAutoGen14Private::_data__height, &ColladaParserAutoGen14Private::_end__height, &ColladaParserAutoGen14Private::_preBegin__height, &ColladaParserAutoGen14Private::_preEnd__height, &ColladaParserAutoGen14Private::_freeAttributes__height);
functionMap[HASH_ELEMENT_RADIUS____FLOAT2] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__radius____float2, &ColladaParserAutoGen14Private::_data__radius____float2, &ColladaParserAutoGen14Private::_end__radius____float2, &ColladaParserAutoGen14Private::_preBegin__radius____float2, &ColladaParserAutoGen14Private::_preEnd__radius____float2, &ColladaParserAutoGen14Private::_freeAttributes__radius____float2);
functionMap[HASH_ELEMENT_BIND_MATERIAL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__bind_material, &ColladaParserAutoGen14Private::_data__bind_material, &ColladaParserAutoGen14Private::_end__bind_material, &ColladaParserAutoGen14Private::_preBegin__bind_material, &ColladaParserAutoGen14Private::_preEnd__bind_material, &ColladaParserAutoGen14Private::_freeAttributes__bind_material);
functionMap[HASH_ELEMENT_PARAM] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__param, &ColladaParserAutoGen14Private::_data__param, &ColladaParserAutoGen14Private::_end__param, &ColladaParserAutoGen14Private::_preBegin__param, &ColladaParserAutoGen14Private::_preEnd__param, &ColladaParserAutoGen14Private::_freeAttributes__param);
functionMap[HASH_ELEMENT_BIND_MATERIAL__TECHNIQUE_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__bind_material__technique_common, &ColladaParserAutoGen14Private::_data__bind_material__technique_common, &ColladaParserAutoGen14Private::_end__bind_material__technique_common, &ColladaParserAutoGen14Private::_preBegin__bind_material__technique_common, &ColladaParserAutoGen14Private::_preEnd__bind_material__technique_common, &ColladaParserAutoGen14Private::_freeAttributes__bind_material__technique_common);
functionMap[HASH_ELEMENT_INSTANCE_MATERIAL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_material, &ColladaParserAutoGen14Private::_data__instance_material, &ColladaParserAutoGen14Private::_end__instance_material, &ColladaParserAutoGen14Private::_preBegin__instance_material, &ColladaParserAutoGen14Private::_preEnd__instance_material, &ColladaParserAutoGen14Private::_freeAttributes__instance_material);
functionMap[HASH_ELEMENT_INSTANCE_MATERIAL__BIND] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__instance_material__bind, &ColladaParserAutoGen14Private::_data__instance_material__bind, &ColladaParserAutoGen14Private::_end__instance_material__bind, &ColladaParserAutoGen14Private::_preBegin__instance_material__bind, &ColladaParserAutoGen14Private::_preEnd__instance_material__bind, &ColladaParserAutoGen14Private::_freeAttributes__instance_material__bind);
functionMap[HASH_ELEMENT_BIND_VERTEX_INPUT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__bind_vertex_input, &ColladaParserAutoGen14Private::_data__bind_vertex_input, &ColladaParserAutoGen14Private::_end__bind_vertex_input, &ColladaParserAutoGen14Private::_preBegin__bind_vertex_input, &ColladaParserAutoGen14Private::_preEnd__bind_vertex_input, &ColladaParserAutoGen14Private::_freeAttributes__bind_vertex_input);
functionMap[HASH_ELEMENT_EQUATION] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__equation, &ColladaParserAutoGen14Private::_data__equation, &ColladaParserAutoGen14Private::_end__equation, &ColladaParserAutoGen14Private::_preBegin__equation, &ColladaParserAutoGen14Private::_preEnd__equation, &ColladaParserAutoGen14Private::_freeAttributes__equation);
functionMap[HASH_ELEMENT_RADIUS____FLOAT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__radius____float, &ColladaParserAutoGen14Private::_data__radius____float, &ColladaParserAutoGen14Private::_end__radius____float, &ColladaParserAutoGen14Private::_preBegin__radius____float, &ColladaParserAutoGen14Private::_preEnd__radius____float, &ColladaParserAutoGen14Private::_freeAttributes__radius____float);
functionMap[HASH_ELEMENT_HEIGHT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__height, &ColladaParserAutoGen14Private::_data__height, &ColladaParserAutoGen14Private::_end__height, &ColladaParserAutoGen14Private::_preBegin__height, &ColladaParserAutoGen14Private::_preEnd__height, &ColladaParserAutoGen14Private::_freeAttributes__height);
functionMap[HASH_ELEMENT_RADIUS1] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__radius1, &ColladaParserAutoGen14Private::_data__radius1, &ColladaParserAutoGen14Private::_end__radius1, &ColladaParserAutoGen14Private::_preBegin__radius1, &ColladaParserAutoGen14Private::_preEnd__radius1, &ColladaParserAutoGen14Private::_freeAttributes__radius1);
functionMap[HASH_ELEMENT_RADIUS2] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__radius2, &ColladaParserAutoGen14Private::_data__radius2, &ColladaParserAutoGen14Private::_end__radius2, &ColladaParserAutoGen14Private::_preBegin__radius2, &ColladaParserAutoGen14Private::_preEnd__radius2, &ColladaParserAutoGen14Private::_freeAttributes__radius2);
functionMap[HASH_ELEMENT_HEIGHT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__height, &ColladaParserAutoGen14Private::_data__height, &ColladaParserAutoGen14Private::_end__height, &ColladaParserAutoGen14Private::_preBegin__height, &ColladaParserAutoGen14Private::_preEnd__height, &ColladaParserAutoGen14Private::_freeAttributes__height);
functionMap[HASH_ELEMENT_RADIUS1] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__radius1, &ColladaParserAutoGen14Private::_data__radius1, &ColladaParserAutoGen14Private::_end__radius1, &ColladaParserAutoGen14Private::_preBegin__radius1, &ColladaParserAutoGen14Private::_preEnd__radius1, &ColladaParserAutoGen14Private::_freeAttributes__radius1);
functionMap[HASH_ELEMENT_RADIUS2] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__radius2, &ColladaParserAutoGen14Private::_data__radius2, &ColladaParserAutoGen14Private::_end__radius2, &ColladaParserAutoGen14Private::_preBegin__radius2, &ColladaParserAutoGen14Private::_preEnd__radius2, &ColladaParserAutoGen14Private::_freeAttributes__radius2);
functionMap[HASH_ELEMENT_RIGID_BODY__TECHNIQUE_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rigid_body__technique_common, &ColladaParserAutoGen14Private::_data__rigid_body__technique_common, &ColladaParserAutoGen14Private::_end__rigid_body__technique_common, &ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common, &ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common, &ColladaParserAutoGen14Private::_freeAttributes__rigid_body__technique_common);
functionMap[HASH_ELEMENT_RIGID_BODY__TECHNIQUE_COMMON__DYNAMIC] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_data__rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_end__rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common__dynamic, &ColladaParserAutoGen14Private::_freeAttributes__rigid_body__technique_common__dynamic);
functionMap[HASH_ELEMENT_INERTIA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__inertia, &ColladaParserAutoGen14Private::_data__inertia, &ColladaParserAutoGen14Private::_end__inertia, &ColladaParserAutoGen14Private::_preBegin__inertia, &ColladaParserAutoGen14Private::_preEnd__inertia, &ColladaParserAutoGen14Private::_freeAttributes__inertia);
functionMap[HASH_ELEMENT_MASS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__mass, &ColladaParserAutoGen14Private::_data__mass, &ColladaParserAutoGen14Private::_end__mass, &ColladaParserAutoGen14Private::_preBegin__mass, &ColladaParserAutoGen14Private::_preEnd__mass, &ColladaParserAutoGen14Private::_freeAttributes__mass);
functionMap[HASH_ELEMENT_RIGID_BODY__TECHNIQUE_COMMON__MASS_FRAME] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_data__rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_end__rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common__mass_frame, &ColladaParserAutoGen14Private::_freeAttributes__rigid_body__technique_common__mass_frame);
functionMap[HASH_ELEMENT_RIGID_BODY__TECHNIQUE_COMMON__SHAPE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_data__rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_end__rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common__shape, &ColladaParserAutoGen14Private::_freeAttributes__rigid_body__technique_common__shape);
functionMap[HASH_ELEMENT_DENSITY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__density, &ColladaParserAutoGen14Private::_data__density, &ColladaParserAutoGen14Private::_end__density, &ColladaParserAutoGen14Private::_preBegin__density, &ColladaParserAutoGen14Private::_preEnd__density, &ColladaParserAutoGen14Private::_freeAttributes__density);
functionMap[HASH_ELEMENT_RIGID_BODY__TECHNIQUE_COMMON__SHAPE__HOLLOW] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_data__rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_end__rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_preBegin__rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_preEnd__rigid_body__technique_common__shape__hollow, &ColladaParserAutoGen14Private::_freeAttributes__rigid_body__technique_common__shape__hollow);
functionMap[HASH_ELEMENT_MASS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__mass, &ColladaParserAutoGen14Private::_data__mass, &ColladaParserAutoGen14Private::_end__mass, &ColladaParserAutoGen14Private::_preBegin__mass, &ColladaParserAutoGen14Private::_preEnd__mass, &ColladaParserAutoGen14Private::_freeAttributes__mass);
functionMap[HASH_ELEMENT_ATTACHMENT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__attachment, &ColladaParserAutoGen14Private::_data__attachment, &ColladaParserAutoGen14Private::_end__attachment, &ColladaParserAutoGen14Private::_preBegin__attachment, &ColladaParserAutoGen14Private::_preEnd__attachment, &ColladaParserAutoGen14Private::_freeAttributes__attachment);
functionMap[HASH_ELEMENT_REF_ATTACHMENT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__ref_attachment, &ColladaParserAutoGen14Private::_data__ref_attachment, &ColladaParserAutoGen14Private::_end__ref_attachment, &ColladaParserAutoGen14Private::_preBegin__ref_attachment, &ColladaParserAutoGen14Private::_preEnd__ref_attachment, &ColladaParserAutoGen14Private::_freeAttributes__ref_attachment);
functionMap[HASH_ELEMENT_RIGID_CONSTRAINT__TECHNIQUE_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__rigid_constraint__technique_common, &ColladaParserAutoGen14Private::_data__rigid_constraint__technique_common, &ColladaParserAutoGen14Private::_end__rigid_constraint__technique_common, &ColladaParserAutoGen14Private::_preBegin__rigid_constraint__technique_common, &ColladaParserAutoGen14Private::_preEnd__rigid_constraint__technique_common, &ColladaParserAutoGen14Private::_freeAttributes__rigid_constraint__technique_common);
functionMap[HASH_ELEMENT_ENABLED] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__enabled, &ColladaParserAutoGen14Private::_data__enabled, &ColladaParserAutoGen14Private::_end__enabled, &ColladaParserAutoGen14Private::_preBegin__enabled, &ColladaParserAutoGen14Private::_preEnd__enabled, &ColladaParserAutoGen14Private::_freeAttributes__enabled);
functionMap[HASH_ELEMENT_INTERPENETRATE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__interpenetrate, &ColladaParserAutoGen14Private::_data__interpenetrate, &ColladaParserAutoGen14Private::_end__interpenetrate, &ColladaParserAutoGen14Private::_preBegin__interpenetrate, &ColladaParserAutoGen14Private::_preEnd__interpenetrate, &ColladaParserAutoGen14Private::_freeAttributes__interpenetrate);
functionMap[HASH_ELEMENT_LIMITS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__limits, &ColladaParserAutoGen14Private::_data__limits, &ColladaParserAutoGen14Private::_end__limits, &ColladaParserAutoGen14Private::_preBegin__limits, &ColladaParserAutoGen14Private::_preEnd__limits, &ColladaParserAutoGen14Private::_freeAttributes__limits);
functionMap[HASH_ELEMENT_SPRING] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__spring, &ColladaParserAutoGen14Private::_data__spring, &ColladaParserAutoGen14Private::_end__spring, &ColladaParserAutoGen14Private::_preBegin__spring, &ColladaParserAutoGen14Private::_preEnd__spring, &ColladaParserAutoGen14Private::_freeAttributes__spring);
functionMap[HASH_ELEMENT_LIMITS__LINEAR] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__limits__linear, &ColladaParserAutoGen14Private::_data__limits__linear, &ColladaParserAutoGen14Private::_end__limits__linear, &ColladaParserAutoGen14Private::_preBegin__limits__linear, &ColladaParserAutoGen14Private::_preEnd__limits__linear, &ColladaParserAutoGen14Private::_freeAttributes__limits__linear);
functionMap[HASH_ELEMENT_SWING_CONE_AND_TWIST] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__swing_cone_and_twist, &ColladaParserAutoGen14Private::_data__swing_cone_and_twist, &ColladaParserAutoGen14Private::_end__swing_cone_and_twist, &ColladaParserAutoGen14Private::_preBegin__swing_cone_and_twist, &ColladaParserAutoGen14Private::_preEnd__swing_cone_and_twist, &ColladaParserAutoGen14Private::_freeAttributes__swing_cone_and_twist);
functionMap[HASH_ELEMENT_MAX] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__max, &ColladaParserAutoGen14Private::_data__max, &ColladaParserAutoGen14Private::_end__max, &ColladaParserAutoGen14Private::_preBegin__max, &ColladaParserAutoGen14Private::_preEnd__max, &ColladaParserAutoGen14Private::_freeAttributes__max);
functionMap[HASH_ELEMENT_MIN] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__min, &ColladaParserAutoGen14Private::_data__min, &ColladaParserAutoGen14Private::_end__min, &ColladaParserAutoGen14Private::_preBegin__min, &ColladaParserAutoGen14Private::_preEnd__min, &ColladaParserAutoGen14Private::_freeAttributes__min);
functionMap[HASH_ELEMENT_MAX] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__max, &ColladaParserAutoGen14Private::_data__max, &ColladaParserAutoGen14Private::_end__max, &ColladaParserAutoGen14Private::_preBegin__max, &ColladaParserAutoGen14Private::_preEnd__max, &ColladaParserAutoGen14Private::_freeAttributes__max);
functionMap[HASH_ELEMENT_MIN] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__min, &ColladaParserAutoGen14Private::_data__min, &ColladaParserAutoGen14Private::_end__min, &ColladaParserAutoGen14Private::_preBegin__min, &ColladaParserAutoGen14Private::_preEnd__min, &ColladaParserAutoGen14Private::_freeAttributes__min);
functionMap[HASH_ELEMENT_ANGULAR] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__angular, &ColladaParserAutoGen14Private::_data__angular, &ColladaParserAutoGen14Private::_end__angular, &ColladaParserAutoGen14Private::_preBegin__angular, &ColladaParserAutoGen14Private::_preEnd__angular, &ColladaParserAutoGen14Private::_freeAttributes__angular);
functionMap[HASH_ELEMENT_SPRING__LINEAR] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__spring__linear, &ColladaParserAutoGen14Private::_data__spring__linear, &ColladaParserAutoGen14Private::_end__spring__linear, &ColladaParserAutoGen14Private::_preBegin__spring__linear, &ColladaParserAutoGen14Private::_preEnd__spring__linear, &ColladaParserAutoGen14Private::_freeAttributes__spring__linear);
functionMap[HASH_ELEMENT_DAMPING] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__damping, &ColladaParserAutoGen14Private::_data__damping, &ColladaParserAutoGen14Private::_end__damping, &ColladaParserAutoGen14Private::_preBegin__damping, &ColladaParserAutoGen14Private::_preEnd__damping, &ColladaParserAutoGen14Private::_freeAttributes__damping);
functionMap[HASH_ELEMENT_STIFFNESS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__stiffness, &ColladaParserAutoGen14Private::_data__stiffness, &ColladaParserAutoGen14Private::_end__stiffness, &ColladaParserAutoGen14Private::_preBegin__stiffness, &ColladaParserAutoGen14Private::_preEnd__stiffness, &ColladaParserAutoGen14Private::_freeAttributes__stiffness);
functionMap[HASH_ELEMENT_TARGET_VALUE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__target_value, &ColladaParserAutoGen14Private::_data__target_value, &ColladaParserAutoGen14Private::_end__target_value, &ColladaParserAutoGen14Private::_preBegin__target_value, &ColladaParserAutoGen14Private::_preEnd__target_value, &ColladaParserAutoGen14Private::_freeAttributes__target_value);
functionMap[HASH_ELEMENT_DAMPING] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__damping, &ColladaParserAutoGen14Private::_data__damping, &ColladaParserAutoGen14Private::_end__damping, &ColladaParserAutoGen14Private::_preBegin__damping, &ColladaParserAutoGen14Private::_preEnd__damping, &ColladaParserAutoGen14Private::_freeAttributes__damping);
functionMap[HASH_ELEMENT_STIFFNESS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__stiffness, &ColladaParserAutoGen14Private::_data__stiffness, &ColladaParserAutoGen14Private::_end__stiffness, &ColladaParserAutoGen14Private::_preBegin__stiffness, &ColladaParserAutoGen14Private::_preEnd__stiffness, &ColladaParserAutoGen14Private::_freeAttributes__stiffness);
functionMap[HASH_ELEMENT_TARGET_VALUE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__target_value, &ColladaParserAutoGen14Private::_data__target_value, &ColladaParserAutoGen14Private::_end__target_value, &ColladaParserAutoGen14Private::_preBegin__target_value, &ColladaParserAutoGen14Private::_preEnd__target_value, &ColladaParserAutoGen14Private::_freeAttributes__target_value);
mapFilled = true;
}
return functionMap;
}